

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info.cpp
# Opt level: O2

tuple<int,_int,_int> get_running_sleeping_total_threads(void)

{
  bool bVar1;
  _Head_base<0UL,_int,_false> extraout_EDX;
  int iVar2;
  int iVar3;
  _Tuple_impl<1UL,_int,_int> in_RDI;
  int iVar4;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *thread;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  tuple<int,_int,_int> tVar5;
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  get_threads_info_abi_cxx11_();
  iVar3 = 0;
  iVar2 = 0;
  iVar4 = 0;
  for (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_48.
               super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_48.
               super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &__lhs[2]._M_string_length) {
    bVar1 = std::operator==(__lhs,"sleeping");
    if (bVar1) {
      iVar3 = iVar3 + 1;
    }
    else {
      bVar1 = std::operator==(__lhs,"running");
      iVar4 = iVar4 + (uint)bVar1;
    }
    iVar2 = iVar2 + 1;
  }
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  *(int *)in_RDI = iVar2;
  *(int *)((long)in_RDI + 4) = iVar3;
  *(int *)((long)in_RDI + 8) = iVar4;
  tVar5.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       extraout_EDX._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = in_RDI;
  return (tuple<int,_int,_int>)tVar5.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> get_running_sleeping_total_threads() {
    int running = 0;
    int sleeping = 0;
    int total = 0;
    for (auto & thread : get_threads_info()) {
        if (std::get<2>(thread) == "sleeping") {
            sleeping++;
        } else if (std::get<2>(thread) == "running") {
            running++;
        }
        total++;
    }
    return std::make_tuple(running, sleeping, total);
}